

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

vector<Occupy,_std::allocator<Occupy>_> *
Common::analyzeOccupies
          (vector<Occupy,_std::allocator<Occupy>_> *__return_storage_ptr__,TaskHandle *head,
          size_t peak_memory,uint64_t origin_time)

{
  _Rb_tree_header *__last;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  _Base_ptr p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  int i;
  ulong uVar8;
  int iVar9;
  anon_class_1_0_00000001 append;
  vector<Occupy,_std::allocator<Occupy>_> occupies_vec;
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> essentials;
  _Rb_tree_node_base local_c0;
  size_t local_a0;
  bool local_98;
  double local_90;
  double dStack_88;
  Random local_80;
  Random local_70;
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> occupies;
  
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&essentials,
             &head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
  iVar3 = 0;
  iVar9 = 1;
  while (essentials._M_t._M_impl._0_8_ != 0) {
    *(int *)(essentials._M_t._M_impl._0_8_ + 0x90) = iVar9;
    if (*(size_t *)(essentials._M_t._M_impl._0_8_ + 0x98) == peak_memory) {
      iVar3 = iVar9;
    }
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&essentials,
               (__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)
               (essentials._M_t._M_impl._0_8_ + 0x80));
    iVar9 = iVar9 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &essentials._M_t._M_impl.super__Rb_tree_header);
  if (iVar3 < 1) {
    __assert_fail("peak_time_stamp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                  ,0x235,
                  "static std::vector<Occupy> Common::analyzeOccupies(TaskHandle &, size_t, uint64_t)"
                 );
  }
  occupies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &occupies._M_t._M_impl.super__Rb_tree_header._M_header;
  occupies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  occupies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  occupies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  occupies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       occupies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&occupies_vec,
             &head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
  while (occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0) {
    if (iVar3 < *(int *)&occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                         super__Vector_impl_data._M_start[1].use.
                         super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      lVar7 = *(long *)&((occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                          super__Vector_impl_data._M_start)->re_gen_ins)._M_t._M_impl;
      p_Var1 = &((occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                  super__Vector_impl_data._M_start)->re_gen).
                super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage[1].
                super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
      while (p_Var6 = &p_Var1->_M_refcount,
            p_Var6 + -3 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)lVar7) {
        if ((p_Var6->_M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (*(int *)&p_Var6->_M_pi[9]._vptr__Sp_counted_base < iVar3)) {
          std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&essentials,
                     (__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)p_Var6);
          std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)
                     &essentials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&occupies_vec);
          local_c0._M_color = _S_red;
          local_c0._4_4_ = 0;
          local_c0._M_parent = (_Base_ptr)0x0;
          essentials._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          essentials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_a0 = 0;
          local_98 = false;
          local_90 = 0.0;
          dStack_88 = 0.0;
          local_c0._M_left = &local_c0;
          local_c0._M_right = &local_c0;
          sVar4 = std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::count
                            (&occupies,(Occupy *)&essentials);
          if ((sVar4 == 0) &&
             (bVar2 = analyzeOccupies::anon_class_1_0_00000001::operator()
                                (&append,(Occupy *)&essentials), bVar2)) {
            std::
            _Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
            ::_M_insert_unique<Occupy_const&>
                      ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                        *)&occupies,(Occupy *)&essentials);
          }
          Occupy::~Occupy((Occupy *)&essentials);
        }
        p_Var1 = (__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 0xc);
      }
    }
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&occupies_vec,
               (__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)
               (occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                super__Vector_impl_data._M_start + 1));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
              super__Vector_impl_data._M_finish);
  occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (p_Var5 = occupies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &occupies._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    Occupy::Occupy((Occupy *)&essentials,(Occupy *)(p_Var5 + 1));
    Occupy::calculate((Occupy *)&essentials,iVar3,peak_memory,origin_time);
    std::vector<Occupy,_std::allocator<Occupy>_>::push_back(&occupies_vec,(Occupy *)&essentials);
    Occupy::~Occupy((Occupy *)&essentials);
  }
  essentials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  essentials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  __last = &essentials._M_t._M_impl.super__Rb_tree_header;
  essentials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  essentials._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  essentials._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  std::
  __sort<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_1_>>
            (occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
             super__Vector_impl_data._M_start,
             occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
             super__Vector_impl_data._M_finish);
  iVar9 = (int)((ulong)((long)occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 7);
  lVar7 = 0;
  for (uVar8 = 0; ((long)uVar8 < (long)iVar9 && (uVar8 < 2)); uVar8 = uVar8 + 1) {
    std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>::
    _M_insert_unique<Occupy_const&>
              ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                *)&essentials,
               (Occupy *)
               ((long)&((occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                         super__Vector_impl_data._M_start)->gen).
                       super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar7));
    lVar7 = lVar7 + 0x80;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_2_>>
            (occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
             super__Vector_impl_data._M_start);
  lVar7 = 0;
  for (uVar8 = 0; ((long)uVar8 < (long)iVar9 && (uVar8 < 2)); uVar8 = uVar8 + 1) {
    std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>::
    _M_insert_unique<Occupy_const&>
              ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                *)&essentials,
               (Occupy *)
               ((long)&((occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                         super__Vector_impl_data._M_start)->gen).
                       super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar7));
    lVar7 = lVar7 + 0x80;
  }
  local_70.engine._M_x = 1;
  local_70.dist._M_param._M_a = 0;
  local_70.dist._M_param._M_b = 0;
  if ((occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
       super__Vector_impl_data._M_start !=
       occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
       super__Vector_impl_data._M_finish) && (iVar3 = Random::operator()(&local_70), iVar3 == 0)) {
    Random::Random(&local_80,0,iVar9,0);
    iVar9 = Random::operator()(&local_80);
    std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>::
    _M_insert_unique<Occupy_const&>
              ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                *)&essentials,
               occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
               super__Vector_impl_data._M_start + iVar9);
  }
  std::vector<Occupy,std::allocator<Occupy>>::vector<std::_Rb_tree_const_iterator<Occupy>,void>
            ((vector<Occupy,std::allocator<Occupy>> *)__return_storage_ptr__,
             (_Rb_tree_const_iterator<Occupy>)
             essentials._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<Occupy>)__last,(allocator_type *)&local_80);
  std::_Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
  ::~_Rb_tree(&essentials._M_t);
  std::vector<Occupy,_std::allocator<Occupy>_>::~vector(&occupies_vec);
  std::_Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
  ::~_Rb_tree(&occupies._M_t);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Occupy> analyzeOccupies(TaskHandle &head, size_t peak_memory, uint64_t origin_time) {
        // Run this function after running analyzeTopology and analyzeMemory
        // Mark tasks and get the peak one
        int time_stamp = 0, peak_time_stamp = 0;
        LOOP(task, head) {
            task->time_stamp = ++ time_stamp;
            if (task->execution_memory == peak_memory) {
                peak_time_stamp = time_stamp;
            }
        }
        assert(peak_time_stamp > 0);

        // Check
        auto append = [](Occupy &occupy) -> bool {
            auto &gen = occupy.gen;
            auto &use = occupy.use;
            occupy.re_gen_ins.insert(gen->ins.begin(), gen->ins.end());

            // We're going to put `gen` before `use`, so we must ensure the inputs of `gen` will not change
            static constexpr int RE_GEN_TASK_LIMIT = 3;
            for (int i = -1; i < RE_GEN_TASK_LIMIT; ++ i) {
                bool found = false;
                OperandUsage bad_usage;
                for (auto &usage: occupy.re_gen_ins) {
                    auto last_gen_before_re_gen = usage.next_gen;
                    while (last_gen_before_re_gen) {
                        auto &re_gen = last_gen_before_re_gen->find(usage.operand);
                        if (re_gen.next_gen and re_gen.next_gen->time_stamp < use->time_stamp) {
                            last_gen_before_re_gen = re_gen.next_gen;
                        } else {
                            break;
                        }
                    }
                    if (last_gen_before_re_gen and last_gen_before_re_gen->time_stamp < use->time_stamp) {
                        auto &re_gen = last_gen_before_re_gen->find(usage.operand);
                        if (re_gen.version != usage.version) {
                            found = true;
                            bad_usage = usage;
                            break;
                        }
                    }
                }
                if (found) {
                    occupy.re_gen.push_back(bad_usage.gen);
                    occupy.re_gen_ins.erase(bad_usage);
                    occupy.re_gen_ins.insert(bad_usage.gen->ins.begin(), bad_usage.gen->ins.end());
                } else {
                    return true;
                }
            }
            return false;
        };

        // Get all occupying pairs
        std::set<Occupy> occupies;
        LOOP(task, head) {
            if (peak_time_stamp >= task->time_stamp) {
                continue;
            }
            for (auto &usage: task->ins) {
                if (usage.gen and usage.gen->time_stamp < peak_time_stamp) {
                    auto occupy = Occupy {usage.gen, task};
                    // .count is a must, because we only accept the first usage
                    if (not occupies.count(occupy) and append(occupy)) {
                        occupies.insert(occupy);
                    }
                }
            }
        }

        // Get scores
        std::vector<Occupy> occupies_vec;
        for (auto &occupy: occupies) {
            auto copied = occupy;
            copied.calculate(peak_time_stamp, peak_memory, origin_time);
            occupies_vec.push_back(copied);
        }

        // O1 Pruning
        std::set<Occupy> essentials;
        std::sort(occupies_vec.begin(), occupies_vec.end(), [](const Occupy &o1, const Occupy &o2) {
            return o1.score1 < o2.score1;
        });
        int size = occupies_vec.size();
        for (int i = 0; i < size and i < O1_OCCUPIES_LIMIT; ++ i) {
            // printf(" > s1: %.3lf s2: %.3lf\n", occupies_vec[i].score1, occupies_vec[i].score2);
            essentials.insert(occupies_vec[i]);
        }

        // O2 Pruning
        std::sort(occupies_vec.begin(), occupies_vec.end(), [](const Occupy &o1, const Occupy &o2) {
            return o1.score2 < o2.score2;
        });
        for (int i = 0; i < size and i < O2_OCCUPIES_LIMIT; ++ i) {
            // printf(" > s1: %.3lf s2: %.3lf\n", occupies_vec[i].score1, occupies_vec[i].score2);
            essentials.insert(occupies_vec[i]);
        }

        // Random
        auto random = Random(0, TIMES_PER_RANDOM);
        if (not occupies_vec.empty() and random() == 0) {
            auto pos = Random(0, size)();
            essentials.insert(occupies_vec[pos]);
        }

        return std::vector<Occupy>(essentials.begin(), essentials.end());
    }